

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O2

void object_copy(object *dest,object *src)

{
  _Bool *p_Var1;
  curse_data *__dest;
  size_t len;
  
  memcpy(dest,src,0x138);
  if (src->slays != (_Bool *)0x0) {
    p_Var1 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
    dest->slays = p_Var1;
    memcpy(p_Var1,src->slays,(ulong)z_info->slay_max);
  }
  if (src->brands != (_Bool *)0x0) {
    p_Var1 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
    dest->brands = p_Var1;
    memcpy(p_Var1,src->brands,(ulong)z_info->brand_max);
  }
  if (src->curses != (curse_data *)0x0) {
    len = (ulong)z_info->curse_max << 3;
    __dest = (curse_data *)mem_zalloc(len);
    dest->curses = __dest;
    memcpy(__dest,src->curses,len);
  }
  dest->prev = (object *)0x0;
  dest->next = (object *)0x0;
  return;
}

Assistant:

void object_copy(struct object *dest, const struct object *src)
{
	/* Copy the structure */
	memcpy(dest, src, sizeof(struct object));

	if (src->slays) {
		dest->slays = mem_zalloc(z_info->slay_max * sizeof(bool));
		memcpy(dest->slays, src->slays, z_info->slay_max * sizeof(bool));
	}
	if (src->brands) {
		dest->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
		memcpy(dest->brands, src->brands, z_info->brand_max * sizeof(bool));
	}
	if (src->curses) {
		size_t array_size = z_info->curse_max * sizeof(struct curse_data);
		dest->curses = mem_zalloc(array_size);
		memcpy(dest->curses, src->curses, array_size);
	}

	/* Detach from any pile */
	dest->prev = NULL;
	dest->next = NULL;
}